

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::anon_unknown_37::FailureTest::FailureTest
          (FailureTest *this,CodeLocation *loc,string *error_message,bool as_error)

{
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_001726b0;
  CodeLocation::CodeLocation(&this->loc_,loc);
  std::__cxx11::string::string((string *)&this->error_message_,(string *)error_message);
  this->as_error_ = true;
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}